

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O0

Am_Priority_List * Am_Priority_List::Create(void)

{
  Am_Priority_List *pAVar1;
  Am_Priority_List *l;
  
  pAVar1 = (Am_Priority_List *)operator_new(0x28);
  pAVar1->number = 0;
  pAVar1->head = (Am_Priority_List_Item *)0x0;
  pAVar1->tail = (Am_Priority_List_Item *)0x0;
  pAVar1->current = (Am_Priority_List_Item *)0x0;
  pAVar1->refs = 1;
  return pAVar1;
}

Assistant:

Am_Priority_List *
Am_Priority_List::Create()
{
  Am_Priority_List *l = new Am_Priority_List;
  l->number = 0;
  l->head = nullptr;
  l->tail = nullptr;
  l->current = nullptr;
  l->refs = 1;
  return l;
}